

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckTypedefs.cxx
# Opt level: O1

bool __thiscall kws::Parser::CheckTypedefs(Parser *this,char *regEx,bool alignment,uint maxLength)

{
  size_t pos_00;
  long lVar1;
  bool bVar2;
  char *__s;
  size_t sVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  size_type *psVar9;
  long *plVar10;
  undefined7 in_register_00000011;
  byte bVar11;
  size_t sVar12;
  size_t sVar13;
  ulong uVar14;
  Error error;
  size_t pos;
  string currentLine;
  string previousLine;
  size_t typedefpos;
  size_t beg;
  string var;
  RegularExpression regex;
  undefined1 local_370 [24];
  _Alloc_hider local_358;
  size_type local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  long local_338;
  size_t local_330;
  int local_324;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  string local_300;
  ulong local_2e0;
  size_t local_2d8;
  size_t local_2d0;
  size_t local_2c8;
  string local_2c0;
  long *local_2a0;
  long local_298;
  long local_290;
  long lStack_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  RegularExpression local_260;
  
  local_324 = (int)CONCAT71(in_register_00000011,alignment);
  if (local_324 != 0) {
    this->m_TestsDone[0x10] = true;
    __s = (char *)operator_new__(0xff);
    builtin_strncpy(__s,"Typedefs should be aligned",0x1b);
    pcVar8 = (char *)this->m_TestsDescription[0x10]._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)(this->m_TestsDescription + 0x10),0,pcVar8,(ulong)__s);
    operator_delete__(__s);
  }
  this->m_TestsDone[0xf] = true;
  std::__cxx11::string::_M_replace
            ((ulong)(this->m_TestsDescription + 0xf),0,
             (char *)this->m_TestsDescription[0xf]._M_string_length,0x17837e);
  std::__cxx11::string::append((char *)(this->m_TestsDescription + 0xf));
  local_260.regmust = (char *)0x0;
  local_260.program = (char *)0x0;
  local_260.progsize = 0;
  memset(&local_260,0,0x20a);
  if (regEx != (char *)0x0) {
    kwssys::RegularExpression::compile(&local_260,regEx);
  }
  local_330 = 0;
  local_2e0 = (ulong)maxLength;
  bVar11 = 0;
  lVar6 = 0;
  sVar13 = 0;
  do {
    local_2c8 = 0;
    local_2d0 = 0;
    FindTypedef_abi_cxx11_
              (&local_2c0,this,local_330 + 1,(this->m_BufferNoComment)._M_string_length,&local_330,
               &local_2c8,&local_2d0);
    pos_00 = local_2c8;
    if (local_2c0._M_string_length != 0) {
      sVar12 = sVar13;
      lVar1 = lVar6;
      if ((char)local_324 != '\0') {
        sVar3 = GetPositionInLine(this,local_2c8);
        local_338 = GetLineNumber(this,pos_00,true);
        lVar4 = GetLineNumber(this,local_2d0,true);
        sVar12 = sVar3;
        lVar1 = local_338;
        if (((ulong)(lVar4 - lVar6) < 2) &&
           (sVar12 = sVar13, local_2d8 = sVar3, sVar13 - sVar3 != 0)) {
          lVar6 = GetLineNumber(this,pos_00,true);
          GetLine_abi_cxx11_(&local_300,this,lVar6 - 2);
          lVar6 = GetLineNumber(this,pos_00,true);
          GetLine_abi_cxx11_(&local_320,this,lVar6 - 1);
          uVar14 = (sVar13 - sVar3) + local_320._M_string_length;
          if (local_2e0 < uVar14) {
            sVar13 = sVar3;
          }
          sVar12 = local_2d8;
          do {
            uVar7 = (ulong)(sVar3 != 0);
            if (sVar12 < 2) break;
            lVar6 = sVar12 - 1;
            uVar7 = sVar12;
            sVar12 = sVar12 - 1;
          } while (local_320._M_dataplus._M_p[lVar6] == ' ');
          uVar7 = (local_300._M_string_length - sVar13) + uVar7 + 1;
          if (uVar7 <= local_2e0) {
            sVar3 = sVar13;
          }
          if ((uVar14 <= local_2e0 &&
              (local_320._M_string_length + local_300._M_string_length <= local_2e0 ||
              local_300._M_dataplus._M_p[local_300._M_string_length - 1] == ';')) &&
              uVar7 <= local_2e0) {
            local_358._M_p = (pointer)&local_348;
            local_350 = 0;
            local_348._M_local_buf[0] = '\0';
            local_370._0_8_ = GetLineNumber(this,pos_00,true);
            local_370._16_8_ = 0x10;
            local_370._8_8_ = local_370._0_8_;
            std::operator+(&local_280,"Type definition (",&local_2c0);
            sVar13 = local_2d8;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_280);
            plVar10 = plVar5 + 2;
            if ((long *)*plVar5 == plVar10) {
              local_290 = *plVar10;
              lStack_288 = plVar5[3];
              local_2a0 = &local_290;
            }
            else {
              local_290 = *plVar10;
              local_2a0 = (long *)*plVar5;
            }
            local_298 = plVar5[1];
            *plVar5 = (long)plVar10;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_358,(string *)&local_2a0);
            if (local_2a0 != &local_290) {
              operator_delete(local_2a0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p != &local_280.field_2) {
              operator_delete(local_280._M_dataplus._M_p);
            }
            pcVar8 = (char *)operator_new__(10);
            snprintf(pcVar8,10,"%zd",sVar13);
            std::__cxx11::string::append((char *)&local_358);
            std::__cxx11::string::append((char *)&local_358);
            snprintf(pcVar8,10,"%zd",sVar3);
            std::__cxx11::string::append((char *)&local_358);
            operator_delete__(pcVar8);
            std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                      (&this->m_ErrorList,(value_type *)local_370);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_p != &local_348) {
              operator_delete(local_358._M_p);
            }
            bVar11 = 1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._M_dataplus._M_p != &local_320.field_2) {
            operator_delete(local_320._M_dataplus._M_p);
          }
          sVar12 = sVar3;
          lVar1 = local_338;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_300._M_dataplus._M_p != &local_300.field_2) {
            operator_delete(local_300._M_dataplus._M_p);
            lVar1 = local_338;
          }
        }
      }
      local_338 = lVar1;
      sVar13 = sVar12;
      bVar2 = kwssys::RegularExpression::find
                        (&local_260,local_2c0._M_dataplus._M_p,&local_260.regmatch);
      lVar6 = local_338;
      if (!bVar2) {
        local_358._M_p = (pointer)&local_348;
        local_350 = 0;
        local_348._M_local_buf[0] = '\0';
        local_370._0_8_ = GetLineNumber(this,local_330,true);
        local_370._16_8_ = 0xf;
        local_370._8_8_ = local_370._0_8_;
        std::operator+(&local_320,"Type definition (",&local_2c0);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_320);
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_300.field_2._M_allocated_capacity = *psVar9;
          local_300.field_2._8_8_ = plVar5[3];
          local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
        }
        else {
          local_300.field_2._M_allocated_capacity = *psVar9;
          local_300._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_300._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_358,(string *)&local_300);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p);
        }
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                  (&this->m_ErrorList,(value_type *)local_370);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_p != &local_348) {
          operator_delete(local_358._M_p);
        }
        bVar11 = 1;
        lVar6 = local_338;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p);
    }
    if (local_330 == 0xffffffffffffffff) {
      if (local_260.program != (char *)0x0) {
        operator_delete__(local_260.program);
      }
      return (bool)(~bVar11 & 1);
    }
  } while( true );
}

Assistant:

bool Parser::CheckTypedefs(const char* regEx, bool alignment,unsigned int maxLength)
{
  if(alignment)
    {
    m_TestsDone[TYPEDEF_ALIGN] = true;
    constexpr size_t length = 255;
    char* val = new char[length];
    snprintf(val,length,"Typedefs should be aligned");
    m_TestsDescription[TYPEDEF_ALIGN] = val;
    delete [] val;
    }

  m_TestsDone[TYPEDEF_REGEX] = true;
  m_TestsDescription[TYPEDEF_REGEX] = "Typedefs should match regular expression: ";
  m_TestsDescription[TYPEDEF_REGEX] += regEx;

  // First we need to find the typedefs
  // typedef type MyTypeDef;
  bool hasError = false;

  kwssys::RegularExpression regex(regEx);

  size_t previousline = 0;
  size_t previouspos = 0;
  size_t pos = 0;
  while(pos!= std::string::npos)
    {
    size_t beg = 0;
    size_t typedefpos = 0;
    std::string var = this->FindTypedef(pos+1,m_BufferNoComment.size(),pos,beg,typedefpos);

    if (var.empty()) {
      continue;
    }
    // Check the alignment if specified
    if(alignment)
      {
      // Find the position in the line
      size_t l = this->GetPositionInLine(beg);
      size_t line = this->GetLineNumber(beg,true);
      size_t typdefline = this->GetLineNumber(typedefpos,true);

      // if the typedef is on a line close to the previous one we check
      if(typdefline-previousline<2)
        {
        if(l!=previouspos)
          {
          bool reportError = true;
          // We check that the previous line is not ending with a semicolon
          // and that the sum of the two lines is more than maxLength
          std::string previousLine = this->GetLine(this->GetLineNumber(beg,true)-2);
          std::string currentLine = this->GetLine(this->GetLineNumber(beg,true)-1);
          if( (previousLine[previousLine.size()-1] != ';')
             && (previousLine.size()+currentLine.size()>maxLength)
            )
            {
            reportError = false;
            }

          // Check if the alignement is possible due to the length of the line
          size_t size = currentLine.size()-l;
          if(previouspos+size>maxLength)
            {
            previouspos = l;
            reportError = false;
            }

          // This one is a bit tricky. Check the minimum
          // typedef igstk::VascularNetworkObject   VascularNetworkObjectType;
          // typedef VascularNetworkObjectType::VesselObjectType VesselObjectType;
          // First find the optimal position (one space) for the current line
          size_t optimalCurrentLinePos = l;
          while(optimalCurrentLinePos>1 && currentLine[optimalCurrentLinePos-1] == ' ')
            {
            optimalCurrentLinePos--;
            }
          optimalCurrentLinePos++;
          // Second find the size of the previous typedefs;
          size_t sizeTypedef = previousLine.size()-previouspos;
          // if the size is too big we don't report
          if(optimalCurrentLinePos+sizeTypedef>maxLength)
            {
            previouspos = l;
            reportError = false;
            }

          if(reportError)
            {
            Error error;
            error.line = this->GetLineNumber(beg,true);
            error.line2 = error.line;
            error.number = TYPEDEF_ALIGN;
            error.description = "Type definition (" + var + ") is not aligned with the previous one: ";
            constexpr size_t length = 10;
            char* localvar = new char[length];
            snprintf(localvar,length,"%zd",l);
            error.description += localvar;
            error.description += " v.s. ";
            snprintf(localvar,length,"%zd",previouspos);
            error.description += localvar;
            delete [] localvar;
            m_ErrorList.push_back(error);
            hasError = true;
            }
          }
        }
      else
        {
        previouspos = l;
        }
      previousline = line;
      }

    if(!regex.find(var))
      {
      Error error;
      error.line = this->GetLineNumber(pos,true);
      error.line2 = error.line;
      error.number = TYPEDEF_REGEX;
      error.description = "Type definition (" + var + ") doesn't match regular expression";
      m_ErrorList.push_back(error);
      hasError = true;
      }
    }
  return !hasError;
}